

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void __thiscall PSBTInput::Unserialize<DataStream>(PSBTInput *this,DataStream *s)

{
  byte bVar1;
  pointer pbVar2;
  size_type sVar3;
  undefined1 auVar4 [8];
  _Base_ptr p_Var5;
  pointer puVar6;
  pointer puVar7;
  bool bVar8;
  bool bVar9;
  uint64_t uVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  pointer pbVar13;
  PSBTInput *__dest;
  const_iterator cVar14;
  const_iterator cVar15;
  const_iterator cVar16;
  _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  *this_00;
  char *pcVar17;
  uchar *__nbytes;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *v;
  _Base_ptr p_Var18;
  undefined1 auVar19 [8];
  ulong uVar20;
  size_t __n;
  pointer pbVar21;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  pVar22;
  SpanReader s_key;
  int sighash;
  SpanReader skey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  XOnlyPubKey xonly;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_bytes;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> leaf_hashes;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  key_lookup;
  SpanReader local_1a0;
  uint local_18c;
  SpanReader local_188;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  KeyOriginInfo local_158;
  undefined1 local_138 [8];
  pointer puStack_130;
  _Base_ptr local_128;
  pointer puStack_120;
  PSBTInput *local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_110;
  undefined1 local_f8 [16];
  _Base_ptr local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_e0;
  pointer puStack_c8;
  pointer local_c0;
  undefined1 local_b8 [8];
  PSBTInput *pPStack_b0;
  _Base_ptr local_a8;
  _Base_ptr p_Stack_a0;
  _Base_ptr local_98;
  size_t local_90;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar8 = false;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start == s->m_read_pos) break;
    local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DataStream::operator>>(s,&local_178);
    puVar7 = local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar6 = local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar8 = true;
      goto LAB_007f46dd;
    }
    local_188.m_data.m_size =
         (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_188.m_data.m_data =
         local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    uVar10 = ReadCompactSize<SpanReader>(&local_188,true);
    switch(uVar10) {
    case 0:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input non-witness utxo already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Non-witness utxo key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      local_118 = (PSBTInput *)&::TX_WITH_WITNESS;
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this;
      UnserializeFromVector<DataStream,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>>>
                (s,(ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)
                   &local_118);
      break;
    case 1:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input witness utxo already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Witness utxo key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      UnserializeFromVector<DataStream,CTxOut&>(s,&this->witness_utxo);
      break;
    case 2:
      if (((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start == 0x22) ||
         ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x42)) {
        CPubKey::
        Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((CPubKey *)local_b8,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        bVar9 = CPubKey::IsFullyValid((CPubKey *)local_b8);
        if (bVar9) {
          CPubKey::GetID((CKeyID *)&local_118,(CPubKey *)local_b8);
          cVar15 = std::
                   _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   ::find(&(this->partial_sigs)._M_t,(key_type *)&local_118);
          if ((_Rb_tree_header *)cVar15._M_node ==
              &(this->partial_sigs)._M_t._M_impl.super__Rb_tree_header) {
            local_138 = (undefined1  [8])0x0;
            puStack_130 = (pointer)0x0;
            local_128 = (_Base_ptr)0x0;
            DataStream::operator>>
                      (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
            CPubKey::GetID((CKeyID *)&local_158,(CPubKey *)local_b8);
            memcpy((pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   &local_118,(CPubKey *)local_b8,0x41);
            vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_138;
            puStack_c8 = puStack_130;
            local_c0 = (pointer)local_128;
            local_138 = (undefined1  [8])0x0;
            puStack_130 = (pointer)0x0;
            local_128 = (_Base_ptr)0x0;
            std::
            _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            ::
            _M_emplace_unique<CKeyID,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        *)&this->partial_sigs,(CKeyID *)&local_158,
                       (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                       )&local_118);
            auVar19 = local_138;
            p_Var18 = local_128;
            if ((pointer)vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              operator_delete(vStack_e0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)local_c0 -
                              (long)vStack_e0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
              auVar19 = local_138;
              p_Var18 = local_128;
            }
            goto joined_r0x007f3a0e;
          }
          pcVar17 = (char *)__cxa_allocate_exception(0x20);
          vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)std::iostream_category();
          local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar17,(error_code *)
                             "Duplicate Key, input partial signature for pubkey already provided");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
        else {
          pcVar17 = (char *)__cxa_allocate_exception(0x20);
          vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)std::iostream_category();
          local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
          std::ios_base::failure[abi:cxx11]::failure(pcVar17,(error_code *)"Invalid pubkey");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
      }
      else {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Size of key was not the expected size for the type partial signature pubkey"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_007f6045;
    case 3:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input sighash type already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Sighash type key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      UnserializeFromVector<DataStream,int&>(s,(int *)&local_18c);
      (this->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> =
           (_Optional_payload_base<int>)((ulong)local_18c | 0x100000000);
      break;
    case 4:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input redeemScript already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        v = &(this->redeem_script).super_CScriptBase;
        if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == 1) goto LAB_007f43d8;
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Input redeemScript key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_007f6045;
    case 5:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input witnessScript already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        v = &(this->witness_script).super_CScriptBase;
        if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == 1) goto LAB_007f43d8;
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Input witnessScript key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_007f6045;
    case 6:
      DeserializeHDKeypaths<DataStream>(s,&local_178,&this->hd_keypaths);
      break;
    case 7:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input final scriptSig already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      v = &(this->final_script_sig).super_CScriptBase;
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Final scriptSig key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
LAB_007f43d8:
      Unserialize<DataStream,28u,unsigned_char>(s,v);
      break;
    case 8:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input final scriptWitness already provided"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Final scriptWitness key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      UnserializeFromVector<DataStream,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
                (s,&(this->final_script_witness).stack);
      break;
    case 9:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
switchD_007f38bc_caseD_9:
      cVar12 = std::
               _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::find(&(this->unknown)._M_t,&local_178);
      if ((_Rb_tree_header *)cVar12._M_node == &(this->unknown)._M_t._M_impl.super__Rb_tree_header)
      {
        local_118 = (PSBTInput *)0x0;
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        DataStream::operator>>
                  (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118);
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&this->unknown,&local_178,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118);
        auVar19 = (undefined1  [8])local_118;
        p_Var18 = (_Base_ptr)
                  vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        goto joined_r0x007f3e54;
      }
      pcVar17 = (char *)__cxa_allocate_exception(0x20);
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)std::iostream_category();
      local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar17,(error_code *)"Duplicate Key, key for unknown value already provided");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_007f6045;
    case 10:
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x15) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_118,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)local_b8);
        if ((long)vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start - (long)local_118 != 0x14) {
LAB_007f47ea:
          pcVar17 = "base_blob<160>::base_blob(Span<const unsigned char>) [BITS = 160]";
LAB_007f47ff:
          __assert_fail("vch.size() == WIDTH",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/uint256.h"
                        ,0x2a,pcVar17);
        }
        memmove((key_type *)local_138,local_118,0x14);
        cVar14 = std::
                 _Rb_tree<uint160,_std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::find(&(this->ripemd160_preimages)._M_t,(key_type *)local_138);
        if ((_Rb_tree_header *)cVar14._M_node ==
            &(this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header) {
          local_b8 = (undefined1  [8])0x0;
          pPStack_b0 = (PSBTInput *)0x0;
          local_a8 = (_Base_ptr)0x0;
          DataStream::operator>>
                    (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
          std::
          _Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::_M_emplace_unique<uint160&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((_Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      *)&this->ripemd160_preimages,(uint160 *)local_138,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
          goto LAB_007f45b4;
        }
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        pPStack_b0 = (PSBTInput *)std::iostream_category();
        local_b8._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input ripemd160 preimage already provided")
        ;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Size of key was not the expected size for the type ripemd160 preimage");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_007f6045;
    case 0xb:
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x21) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_b8,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_118);
        if ((long)pPStack_b0 - (long)local_b8 != 0x20) {
LAB_007f47d3:
          pcVar17 = "base_blob<256>::base_blob(Span<const unsigned char>) [BITS = 256]";
          goto LAB_007f47ff;
        }
        memmove((pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                &local_118,(void *)local_b8,0x20);
        cVar16 = std::
                 _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::find(&(this->sha256_preimages)._M_t,(key_type *)&local_118);
        if ((_Rb_tree_header *)cVar16._M_node ==
            &(this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header) {
          local_138 = (undefined1  [8])0x0;
          puStack_130 = (pointer)0x0;
          local_128 = (_Base_ptr)0x0;
          DataStream::operator>>
                    (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::_M_emplace_unique<uint256&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((_Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      *)&this->sha256_preimages,(uint256 *)&local_118,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
          auVar4 = local_138;
          p_Var5 = local_128;
          goto joined_r0x007f46ae;
        }
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        puStack_130 = (pointer)std::iostream_category();
        local_138._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input sha256 preimage already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Size of key was not the expected size for the type sha256 preimage");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_007f6045;
    case 0xc:
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x15) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_118,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)local_b8);
        if ((long)vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start - (long)local_118 != 0x14)
        goto LAB_007f47ea;
        memmove((key_type *)local_138,local_118,0x14);
        cVar14 = std::
                 _Rb_tree<uint160,_std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::find(&(this->hash160_preimages)._M_t,(key_type *)local_138);
        if ((_Rb_tree_header *)cVar14._M_node ==
            &(this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header) {
          local_b8 = (undefined1  [8])0x0;
          pPStack_b0 = (PSBTInput *)0x0;
          local_a8 = (_Base_ptr)0x0;
          DataStream::operator>>
                    (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
          std::
          _Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::_M_emplace_unique<uint160&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((_Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      *)&this->hash160_preimages,(uint160 *)local_138,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
LAB_007f45b4:
          auVar19 = (undefined1  [8])local_118;
          p_Var18 = (_Base_ptr)
                    vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (local_b8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_b8,(long)local_a8 - (long)local_b8);
            auVar19 = (undefined1  [8])local_118;
            p_Var18 = (_Base_ptr)
                      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          goto joined_r0x007f3e54;
        }
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        pPStack_b0 = (PSBTInput *)std::iostream_category();
        local_b8._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input hash160 preimage already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Size of key was not the expected size for the type hash160 preimage");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_007f6045;
    case 0xd:
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0x21) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_b8,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_118);
        if ((long)pPStack_b0 - (long)local_b8 != 0x20) goto LAB_007f47d3;
        memmove((pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                &local_118,(void *)local_b8,0x20);
        cVar16 = std::
                 _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::find(&(this->hash256_preimages)._M_t,(key_type *)&local_118);
        if ((_Rb_tree_header *)cVar16._M_node ==
            &(this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header) {
          local_138 = (undefined1  [8])0x0;
          puStack_130 = (pointer)0x0;
          local_128 = (_Base_ptr)0x0;
          DataStream::operator>>
                    (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::_M_emplace_unique<uint256&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((_Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      *)&this->hash256_preimages,(uint256 *)&local_118,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
          auVar4 = local_138;
          p_Var5 = local_128;
          goto joined_r0x007f46ae;
        }
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        puStack_130 = (pointer)std::iostream_category();
        local_138._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input hash256 preimage already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Size of key was not the expected size for the type hash256 preimage");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_007f6045;
    case 0x13:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Duplicate Key, input Taproot key signature already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Input Taproot key signature key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      DataStream::operator>>(s,&this->m_tap_key_sig);
      uVar20 = (long)(this->m_tap_key_sig).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_tap_key_sig).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar20 < 0x40) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Input Taproot key path signature is shorter than 64 bytes"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if (0x41 < uVar20) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Input Taproot key path signature is longer than 65 bytes")
        ;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      break;
    case 0x14:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Duplicate Key, input Taproot script signature already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0x41) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Input Taproot script signature key is not 65 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      __nbytes = local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start + 1;
      local_1a0.m_data.m_size = 0x40;
      local_a8 = (_Base_ptr)0x0;
      p_Stack_a0 = (_Base_ptr)0x0;
      local_b8 = (undefined1  [8])0x0;
      pPStack_b0 = (PSBTInput *)0x0;
      local_128 = (_Base_ptr)0x0;
      puStack_120 = (pointer)0x0;
      local_138 = (undefined1  [8])0x0;
      puStack_130 = (pointer)0x0;
      local_1a0.m_data.m_data = __nbytes;
      SpanReader::read(&local_1a0,(int)local_b8,(void *)0x20,(size_t)__nbytes);
      SpanReader::read(&local_1a0,(int)local_138,(void *)0x20,(size_t)__nbytes);
      local_158._0_8_ = (PSBTInput *)0x0;
      local_158.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      DataStream::operator>>(s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158);
      if ((ulong)((long)local_158.path.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start - local_158._0_8_) < 0x40) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Input Taproot script path signature is shorter than 64 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if (0x41 < (ulong)((long)local_158.path.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start - local_158._0_8_)) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Input Taproot script path signature is longer than 65 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_a8;
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)p_Stack_a0;
      local_118 = (PSBTInput *)local_b8;
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pPStack_b0;
      local_e8 = local_128;
      vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puStack_120;
      local_f8._0_8_ = local_138;
      local_f8._8_8_ = puStack_130;
      std::
      _Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
      ::
      _M_emplace_unique<std::pair<XOnlyPubKey,uint256>,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                ((_Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                  *)&this->m_tap_script_sigs,(pair<XOnlyPubKey,_uint256> *)&local_118,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158);
      auVar19 = (undefined1  [8])local_158._0_8_;
      p_Var18 = (_Base_ptr)
                local_158.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
joined_r0x007f3e54:
      if (auVar19 != (undefined1  [8])0x0) {
LAB_007f46d5:
        operator_delete((void *)auVar19,(long)p_Var18 - (long)auVar19);
      }
      break;
    case 0x15:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input Taproot leaf script already provided"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if ((ulong)((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start) < 0x22) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Taproot leaf script key is not at least 34 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if (((int)((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start) + 0x1eU & 0x1f) != 0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Input Taproot leaf script key\'s control block size is not valid");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      local_b8 = (undefined1  [8])0x0;
      pPStack_b0 = (PSBTInput *)0x0;
      local_a8 = (_Base_ptr)0x0;
      DataStream::operator>>(s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
      if (local_b8 == (undefined1  [8])pPStack_b0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Input Taproot leaf script must be at least 1 byte");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      bVar1 = pPStack_b0[-1].sighash_type.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>.field_0x7;
      pPStack_b0 = (PSBTInput *)
                   &pPStack_b0[-1].sighash_type.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>.field_0x7;
      local_118 = (PSBTInput *)0x0;
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar20 = (long)pPStack_b0 - (long)local_b8;
      if (uVar20 == 0) {
        __dest = (PSBTInput *)0x0;
      }
      else {
        if ((long)uVar20 < 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_007f6045;
          std::__throw_bad_alloc();
          goto LAB_007f4769;
        }
        __dest = (PSBTInput *)operator_new(uVar20);
      }
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar20 + (long)__dest);
      __n = (long)pPStack_b0 - (long)local_b8;
      local_118 = __dest;
      if (__n != 0) {
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)__dest;
        memmove(__dest,(void *)local_b8,__n);
      }
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((long)__dest + __n);
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(vStack_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(uint)bVar1);
      this_00 = (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                 *)std::
                   map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                   ::operator[](&this->m_tap_scripts,(key_type *)&local_118);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_138,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_158);
      std::
      _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::_M_insert_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
      auVar4 = (undefined1  [8])local_118;
      p_Var5 = (_Base_ptr)
               vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_138 != (undefined1  [8])0x0) {
        operator_delete((void *)local_138,(long)local_128 - (long)local_138);
        auVar4 = (undefined1  [8])local_118;
        p_Var5 = (_Base_ptr)
                 vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
joined_r0x007f46ae:
      auVar19 = local_b8;
      p_Var18 = local_a8;
      if (auVar4 != (undefined1  [8])0x0) {
        operator_delete((void *)auVar4,(long)p_Var5 - (long)auVar4);
        auVar19 = local_b8;
        p_Var18 = local_a8;
      }
joined_r0x007f3a0e:
      if (auVar19 == (undefined1  [8])0x0) break;
      goto LAB_007f46d5;
    case 0x16:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Duplicate Key, input Taproot BIP32 keypath already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0x21) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Input Taproot BIP32 keypath key is not at 33 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      local_1a0.m_data.m_data =
           local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      local_1a0.m_data.m_size = 0x20;
      local_128 = (_Base_ptr)0x0;
      puStack_120 = (pointer)0x0;
      local_138 = (undefined1  [8])0x0;
      puStack_130 = (pointer)0x0;
      SpanReader::read(&local_1a0,(int)local_138,(void *)0x20,(size_t)local_1a0.m_data.m_data);
      pPStack_b0 = (PSBTInput *)((ulong)pPStack_b0 & 0xffffffff00000000);
      local_a8 = (_Base_ptr)0x0;
      p_Stack_a0 = (_Base_ptr)&pPStack_b0;
      local_90 = 0;
      local_98 = p_Stack_a0;
      pbVar13 = (pointer)ReadCompactSize<DataStream>(s,true);
      pbVar2 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_start;
      pbVar21 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      sVar3 = s->m_read_pos;
      Unserialize<DataStream,uint256,std::less<uint256>,std::allocator<uint256>>
                (s,(set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)local_b8);
      pbVar21 = pbVar21 + (long)((s->vch).
                                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                                (s->m_read_pos -
                                (long)((s->vch).
                                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                       ._M_impl.super__Vector_impl_data._M_finish +
                                      (long)(pbVar2 + sVar3))));
      if (pbVar13 < pbVar21) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Input Taproot BIP32 keypath has an invalid length");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      DeserializeKeyOrigin<DataStream>(&local_158,s,(long)pbVar13 - (long)pbVar21);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                  *)&local_118,
                 (_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                  *)local_b8);
      local_e8 = (_Base_ptr)CONCAT44(local_e8._4_4_,local_158.fingerprint);
      vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_158.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_158.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_158.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_158.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
      ::
      _M_emplace_unique<XOnlyPubKey&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                  *)&this->m_tap_bip32_paths,(XOnlyPubKey *)local_138,
                 (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                  *)&local_118);
      if ((pointer)vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_e0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_e0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                   *)&local_118);
      if (local_158.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.path.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.path.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.path.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                   *)local_b8);
      break;
    case 0x17:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)
                           "Duplicate Key, input Taproot internal key already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Input Taproot internal key key is more than one byte type"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      UnserializeFromVector<DataStream,XOnlyPubKey&>(s,&this->m_tap_internal_key);
      break;
    case 0x18:
      pVar22 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_178);
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Duplicate Key, input Taproot merkle root already provided"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar17 = (char *)__cxa_allocate_exception(0x20);
        vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar17,(error_code *)"Input Taproot merkle root key is more than one byte type")
        ;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007f6045;
      }
      UnserializeFromVector<DataStream,uint256&>(s,&this->m_tap_merkle_root);
      break;
    default:
      if (uVar10 != 0xfc) goto switchD_007f38bc_caseD_9;
      vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8._8_8_ = (pointer)0x0;
      local_e8 = (_Base_ptr)0x0;
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f8._0_8_ = (PSBTInput *)0x0;
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SpanReader::operator>>(&local_188,&vStack_110);
      local_118 = (PSBTInput *)ReadCompactSize<SpanReader>(&local_188,true);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8,&local_178);
      cVar11 = std::
               _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
               ::find(&(this->m_proprietary)._M_t,(key_type *)&local_118);
      if ((_Rb_tree_header *)cVar11._M_node ==
          &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header) {
        DataStream::operator>>(s,&vStack_e0);
        std::
        _Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
        ::_M_insert_unique<PSBTProprietary_const&>
                  ((_Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
                    *)&this->m_proprietary,(PSBTProprietary *)&local_118);
        if ((pointer)vStack_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_e0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_e0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_e0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        auVar19 = (undefined1  [8])
                  vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        p_Var18 = (_Base_ptr)
                  vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((PSBTInput *)local_f8._0_8_ != (PSBTInput *)0x0) {
          operator_delete((void *)local_f8._0_8_,(long)local_e8 - local_f8._0_8_);
          auVar19 = (undefined1  [8])
                    vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          p_Var18 = (_Base_ptr)
                    vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        goto joined_r0x007f3a0e;
      }
      pcVar17 = (char *)__cxa_allocate_exception(0x20);
      pPStack_b0 = (PSBTInput *)std::iostream_category();
      local_b8._0_4_ = 1;
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar17,(error_code *)"Duplicate Key, proprietary key already found");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_007f6045;
    }
LAB_007f46dd:
    if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_178.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  } while (puVar6 != puVar7);
  if (bVar8) {
    std::
    _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~_Rb_tree(&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
LAB_007f4769:
    pcVar17 = (char *)__cxa_allocate_exception(0x20);
    vStack_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)std::iostream_category();
    local_118 = (PSBTInput *)CONCAT44(local_118._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar17,(error_code *)"Separator is missing at the end of an input map");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pcVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_007f6045:
  __stack_chk_fail();
}

Assistant:

inline void Unserialize(Stream& s) {
        // Used for duplicate key detection
        std::set<std::vector<unsigned char>> key_lookup;

        // Read loop
        bool found_sep = false;
        while(!s.empty()) {
            // Read
            std::vector<unsigned char> key;
            s >> key;

            // the key is empty if that was actually a separator byte
            // This is a special case for key lengths 0 as those are not allowed (except for separator)
            if (key.empty()) {
                found_sep = true;
                break;
            }

            // Type is compact size uint at beginning of key
            SpanReader skey{key};
            uint64_t type = ReadCompactSize(skey);

            // Do stuff based on type
            switch(type) {
                case PSBT_IN_NON_WITNESS_UTXO:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input non-witness utxo already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Non-witness utxo key is more than one byte type");
                    }
                    // Set the stream to unserialize with witness since this is always a valid network transaction
                    UnserializeFromVector(s, TX_WITH_WITNESS(non_witness_utxo));
                    break;
                }
                case PSBT_IN_WITNESS_UTXO:
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input witness utxo already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Witness utxo key is more than one byte type");
                    }
                    UnserializeFromVector(s, witness_utxo);
                    break;
                case PSBT_IN_PARTIAL_SIG:
                {
                    // Make sure that the key is the size of pubkey + 1
                    if (key.size() != CPubKey::SIZE + 1 && key.size() != CPubKey::COMPRESSED_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type partial signature pubkey");
                    }
                    // Read in the pubkey from key
                    CPubKey pubkey(key.begin() + 1, key.end());
                    if (!pubkey.IsFullyValid()) {
                       throw std::ios_base::failure("Invalid pubkey");
                    }
                    if (partial_sigs.count(pubkey.GetID()) > 0) {
                        throw std::ios_base::failure("Duplicate Key, input partial signature for pubkey already provided");
                    }

                    // Read in the signature from value
                    std::vector<unsigned char> sig;
                    s >> sig;

                    // Add to list
                    partial_sigs.emplace(pubkey.GetID(), SigPair(pubkey, std::move(sig)));
                    break;
                }
                case PSBT_IN_SIGHASH:
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input sighash type already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Sighash type key is more than one byte type");
                    }
                    int sighash;
                    UnserializeFromVector(s, sighash);
                    sighash_type = sighash;
                    break;
                case PSBT_IN_REDEEMSCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input redeemScript already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Input redeemScript key is more than one byte type");
                    }
                    s >> redeem_script;
                    break;
                }
                case PSBT_IN_WITNESSSCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input witnessScript already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Input witnessScript key is more than one byte type");
                    }
                    s >> witness_script;
                    break;
                }
                case PSBT_IN_BIP32_DERIVATION:
                {
                    DeserializeHDKeypaths(s, key, hd_keypaths);
                    break;
                }
                case PSBT_IN_SCRIPTSIG:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input final scriptSig already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Final scriptSig key is more than one byte type");
                    }
                    s >> final_script_sig;
                    break;
                }
                case PSBT_IN_SCRIPTWITNESS:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input final scriptWitness already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Final scriptWitness key is more than one byte type");
                    }
                    UnserializeFromVector(s, final_script_witness.stack);
                    break;
                }
                case PSBT_IN_RIPEMD160:
                {
                    // Make sure that the key is the size of a ripemd160 hash + 1
                    if (key.size() != CRIPEMD160::OUTPUT_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type ripemd160 preimage");
                    }
                    // Read in the hash from key
                    std::vector<unsigned char> hash_vec(key.begin() + 1, key.end());
                    uint160 hash(hash_vec);
                    if (ripemd160_preimages.count(hash) > 0) {
                        throw std::ios_base::failure("Duplicate Key, input ripemd160 preimage already provided");
                    }

                    // Read in the preimage from value
                    std::vector<unsigned char> preimage;
                    s >> preimage;

                    // Add to preimages list
                    ripemd160_preimages.emplace(hash, std::move(preimage));
                    break;
                }
                case PSBT_IN_SHA256:
                {
                    // Make sure that the key is the size of a sha256 hash + 1
                    if (key.size() != CSHA256::OUTPUT_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type sha256 preimage");
                    }
                    // Read in the hash from key
                    std::vector<unsigned char> hash_vec(key.begin() + 1, key.end());
                    uint256 hash(hash_vec);
                    if (sha256_preimages.count(hash) > 0) {
                        throw std::ios_base::failure("Duplicate Key, input sha256 preimage already provided");
                    }

                    // Read in the preimage from value
                    std::vector<unsigned char> preimage;
                    s >> preimage;

                    // Add to preimages list
                    sha256_preimages.emplace(hash, std::move(preimage));
                    break;
                }
                case PSBT_IN_HASH160:
                {
                    // Make sure that the key is the size of a hash160 hash + 1
                    if (key.size() != CHash160::OUTPUT_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type hash160 preimage");
                    }
                    // Read in the hash from key
                    std::vector<unsigned char> hash_vec(key.begin() + 1, key.end());
                    uint160 hash(hash_vec);
                    if (hash160_preimages.count(hash) > 0) {
                        throw std::ios_base::failure("Duplicate Key, input hash160 preimage already provided");
                    }

                    // Read in the preimage from value
                    std::vector<unsigned char> preimage;
                    s >> preimage;

                    // Add to preimages list
                    hash160_preimages.emplace(hash, std::move(preimage));
                    break;
                }
                case PSBT_IN_HASH256:
                {
                    // Make sure that the key is the size of a hash256 hash + 1
                    if (key.size() != CHash256::OUTPUT_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type hash256 preimage");
                    }
                    // Read in the hash from key
                    std::vector<unsigned char> hash_vec(key.begin() + 1, key.end());
                    uint256 hash(hash_vec);
                    if (hash256_preimages.count(hash) > 0) {
                        throw std::ios_base::failure("Duplicate Key, input hash256 preimage already provided");
                    }

                    // Read in the preimage from value
                    std::vector<unsigned char> preimage;
                    s >> preimage;

                    // Add to preimages list
                    hash256_preimages.emplace(hash, std::move(preimage));
                    break;
                }
                case PSBT_IN_TAP_KEY_SIG:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot key signature already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Input Taproot key signature key is more than one byte type");
                    }
                    s >> m_tap_key_sig;
                    if (m_tap_key_sig.size() < 64) {
                        throw std::ios_base::failure("Input Taproot key path signature is shorter than 64 bytes");
                    } else if (m_tap_key_sig.size() > 65) {
                        throw std::ios_base::failure("Input Taproot key path signature is longer than 65 bytes");
                    }
                    break;
                }
                case PSBT_IN_TAP_SCRIPT_SIG:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot script signature already provided");
                    } else if (key.size() != 65) {
                        throw std::ios_base::failure("Input Taproot script signature key is not 65 bytes");
                    }
                    SpanReader s_key{Span{key}.subspan(1)};
                    XOnlyPubKey xonly;
                    uint256 hash;
                    s_key >> xonly;
                    s_key >> hash;
                    std::vector<unsigned char> sig;
                    s >> sig;
                    if (sig.size() < 64) {
                        throw std::ios_base::failure("Input Taproot script path signature is shorter than 64 bytes");
                    } else if (sig.size() > 65) {
                        throw std::ios_base::failure("Input Taproot script path signature is longer than 65 bytes");
                    }
                    m_tap_script_sigs.emplace(std::make_pair(xonly, hash), sig);
                    break;
                }
                case PSBT_IN_TAP_LEAF_SCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot leaf script already provided");
                    } else if (key.size() < 34) {
                        throw std::ios_base::failure("Taproot leaf script key is not at least 34 bytes");
                    } else if ((key.size() - 2) % 32 != 0) {
                        throw std::ios_base::failure("Input Taproot leaf script key's control block size is not valid");
                    }
                    std::vector<unsigned char> script_v;
                    s >> script_v;
                    if (script_v.empty()) {
                        throw std::ios_base::failure("Input Taproot leaf script must be at least 1 byte");
                    }
                    uint8_t leaf_ver = script_v.back();
                    script_v.pop_back();
                    const auto leaf_script = std::make_pair(script_v, (int)leaf_ver);
                    m_tap_scripts[leaf_script].insert(std::vector<unsigned char>(key.begin() + 1, key.end()));
                    break;
                }
                case PSBT_IN_TAP_BIP32_DERIVATION:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot BIP32 keypath already provided");
                    } else if (key.size() != 33) {
                        throw std::ios_base::failure("Input Taproot BIP32 keypath key is not at 33 bytes");
                    }
                    SpanReader s_key{Span{key}.subspan(1)};
                    XOnlyPubKey xonly;
                    s_key >> xonly;
                    std::set<uint256> leaf_hashes;
                    uint64_t value_len = ReadCompactSize(s);
                    size_t before_hashes = s.size();
                    s >> leaf_hashes;
                    size_t after_hashes = s.size();
                    size_t hashes_len = before_hashes - after_hashes;
                    if (hashes_len > value_len) {
                        throw std::ios_base::failure("Input Taproot BIP32 keypath has an invalid length");
                    }
                    size_t origin_len = value_len - hashes_len;
                    m_tap_bip32_paths.emplace(xonly, std::make_pair(leaf_hashes, DeserializeKeyOrigin(s, origin_len)));
                    break;
                }
                case PSBT_IN_TAP_INTERNAL_KEY:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot internal key already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Input Taproot internal key key is more than one byte type");
                    }
                    UnserializeFromVector(s, m_tap_internal_key);
                    break;
                }
                case PSBT_IN_TAP_MERKLE_ROOT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, input Taproot merkle root already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Input Taproot merkle root key is more than one byte type");
                    }
                    UnserializeFromVector(s, m_tap_merkle_root);
                    break;
                }
                case PSBT_IN_PROPRIETARY:
                {
                    PSBTProprietary this_prop;
                    skey >> this_prop.identifier;
                    this_prop.subtype = ReadCompactSize(skey);
                    this_prop.key = key;

                    if (m_proprietary.count(this_prop) > 0) {
                        throw std::ios_base::failure("Duplicate Key, proprietary key already found");
                    }
                    s >> this_prop.value;
                    m_proprietary.insert(this_prop);
                    break;
                }
                // Unknown stuff
                default:
                    if (unknown.count(key) > 0) {
                        throw std::ios_base::failure("Duplicate Key, key for unknown value already provided");
                    }
                    // Read in the value
                    std::vector<unsigned char> val_bytes;
                    s >> val_bytes;
                    unknown.emplace(std::move(key), std::move(val_bytes));
                    break;
            }
        }

        if (!found_sep) {
            throw std::ios_base::failure("Separator is missing at the end of an input map");
        }
    }